

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O3

int __thiscall CCNR::Mersenne::next(Mersenne *this,int bound)

{
  uint uVar1;
  
  do {
    uVar1 = next32(this);
  } while ((int)((uVar1 >> 1) + bound) < 0);
  return (uVar1 >> 1) % (uint)bound;
}

Assistant:

int Mersenne::next(int bound)
{
    unsigned int value;
    do {
        value = next31();
    } while (value + (unsigned int)bound >= 0x80000000UL);
    // Just using modulo doesn't lead to uniform distribution. This does.
    return (int)(value % bound);
}